

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

QSize __thiscall QAbstractItemView::sizeHintForIndex(QAbstractItemView *this,QModelIndex *index)

{
  bool bVar1;
  long *plVar2;
  undefined8 in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemDelegate *delegate;
  QAbstractItemViewPrivate *d;
  QStyleOptionViewItem option;
  QStyleOptionViewItem *in_stack_fffffffffffffef0;
  QAbstractItemViewPrivate *in_stack_ffffffffffffff00;
  QSize local_e0;
  undefined1 local_d8 [208];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QAbstractItemView *)0x80c3b5);
  bVar1 = QAbstractItemViewPrivate::isIndexValid(in_stack_ffffffffffffff00,in_RDI);
  if (bVar1) {
    plVar2 = (long *)(**(code **)(*(long *)in_RDI + 0x208))(in_RDI,in_RSI);
    memset(local_d8,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem((QStyleOptionViewItem *)0x80c412);
    (**(code **)(*(long *)in_RDI + 0x2f8))(in_RDI,local_d8);
    if (plVar2 == (long *)0x0) {
      QSize::QSize((QSize *)in_stack_fffffffffffffef0);
    }
    else {
      local_e0 = (QSize)(**(code **)(*plVar2 + 0x68))(plVar2,local_d8,in_RSI);
    }
    QStyleOptionViewItem::~QStyleOptionViewItem(in_stack_fffffffffffffef0);
  }
  else {
    QSize::QSize((QSize *)in_stack_fffffffffffffef0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_e0;
  }
  __stack_chk_fail();
}

Assistant:

QSize QAbstractItemView::sizeHintForIndex(const QModelIndex &index) const
{
    Q_D(const QAbstractItemView);
    if (!d->isIndexValid(index))
        return QSize();
    const auto delegate = itemDelegateForIndex(index);
    QStyleOptionViewItem option;
    initViewItemOption(&option);
    return delegate ? delegate->sizeHint(option, index) : QSize();
}